

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vm.cpp
# Opt level: O2

_tExecReaction __thiscall yactfr::internal::Vm::_execSetPktTotalLen(Vm *this,Instr *param_1)

{
  ulong expectedLen;
  ulong uVar1;
  Index offsetInPkt;
  ExpectedPacketTotalLengthLessThanOffsetInPacketDecodingError *this_00;
  pointer_____offset_0x10___ *ppuVar2;
  
  expectedLen = (this->_pos).lastIntVal.u;
  if ((expectedLen & 7) == 0) {
    uVar1 = (this->_pos).curExpectedPktContentLenBits;
    if (expectedLen < uVar1 && uVar1 != 0xffffffffffffffff) {
      this_00 = (ExpectedPacketTotalLengthLessThanOffsetInPacketDecodingError *)
                __cxa_allocate_exception(0x48);
      ExpectedPacketTotalLengthLessThanExpectedPacketContentLengthDecodingError::
      ExpectedPacketTotalLengthLessThanExpectedPacketContentLengthDecodingError
                ((ExpectedPacketTotalLengthLessThanExpectedPacketContentLengthDecodingError *)
                 this_00,(this->_pos).headOffsetInCurPktBits +
                         (this->_pos).curPktOffsetInElemSeqBits,expectedLen,
                 (this->_pos).curExpectedPktContentLenBits);
      ppuVar2 = &ExpectedPacketTotalLengthLessThanExpectedPacketContentLengthDecodingError::typeinfo
      ;
    }
    else {
      if ((this->_pos).headOffsetInCurPktBits <= expectedLen) {
        (this->_pos).curExpectedPktTotalLenBits = expectedLen;
        if (uVar1 == 0xffffffffffffffff) {
          (this->_pos).curExpectedPktContentLenBits = expectedLen;
        }
        return ExecNextInstr;
      }
      this_00 = (ExpectedPacketTotalLengthLessThanOffsetInPacketDecodingError *)
                __cxa_allocate_exception(0x48);
      offsetInPkt = (this->_pos).headOffsetInCurPktBits;
      ExpectedPacketTotalLengthLessThanOffsetInPacketDecodingError::
      ExpectedPacketTotalLengthLessThanOffsetInPacketDecodingError
                (this_00,(this->_pos).curPktOffsetInElemSeqBits + offsetInPkt,expectedLen,
                 offsetInPkt);
      ppuVar2 = &ExpectedPacketTotalLengthLessThanOffsetInPacketDecodingError::typeinfo;
    }
  }
  else {
    this_00 = (ExpectedPacketTotalLengthLessThanOffsetInPacketDecodingError *)
              __cxa_allocate_exception(0x40);
    ExpectedPacketTotalLengthNotMultipleOf8DecodingError::
    ExpectedPacketTotalLengthNotMultipleOf8DecodingError
              ((ExpectedPacketTotalLengthNotMultipleOf8DecodingError *)this_00,
               (this->_pos).headOffsetInCurPktBits + (this->_pos).curPktOffsetInElemSeqBits,
               expectedLen);
    ppuVar2 = &ExpectedPacketTotalLengthNotMultipleOf8DecodingError::typeinfo;
  }
  __cxa_throw(this_00,ppuVar2,DecodingError::~DecodingError);
}

Assistant:

Vm::_tExecReaction Vm::_execSetPktTotalLen(const Instr&)
{
    const auto pktTotalSizeCandidateBits = _pos.lastIntVal.u;

    if ((pktTotalSizeCandidateBits & 7) != 0) {
        throw ExpectedPacketTotalLengthNotMultipleOf8DecodingError {
            _pos.headOffsetInElemSeqBits(),
            pktTotalSizeCandidateBits
        };
    }

    if (_pos.curExpectedPktContentLenBits != sizeUnset) {
        if (pktTotalSizeCandidateBits < _pos.curExpectedPktContentLenBits) {
            throw ExpectedPacketTotalLengthLessThanExpectedPacketContentLengthDecodingError {
                _pos.headOffsetInElemSeqBits(),
                pktTotalSizeCandidateBits,
                _pos.curExpectedPktContentLenBits
            };
        }
    }

    if (pktTotalSizeCandidateBits < _pos.headOffsetInCurPktBits) {
        throw ExpectedPacketTotalLengthLessThanOffsetInPacketDecodingError {
            _pos.headOffsetInElemSeqBits(),
            pktTotalSizeCandidateBits,
            _pos.headOffsetInCurPktBits
        };
    }

    _pos.curExpectedPktTotalLenBits = pktTotalSizeCandidateBits;

    if (_pos.curExpectedPktContentLenBits == sizeUnset) {
        _pos.curExpectedPktContentLenBits = _pos.curExpectedPktTotalLenBits;
    }

    return _tExecReaction::ExecNextInstr;
}